

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall
wallet::LegacyScriptPubKeyMan::AddKeyPubKeyWithDB
          (LegacyScriptPubKeyMan *this,WalletBatch *batch,CKey *secret,CPubKey *pubkey)

{
  WalletStorage *pWVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  mapped_type *keyMeta;
  long in_FS_OFFSET;
  void *local_dc [2];
  uchar local_cc [4];
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_c8;
  undefined1 local_80;
  direct_or_indirect local_78;
  uint local_5c;
  direct_or_indirect local_58;
  uint uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar1 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
  iVar4 = (*pWVar1->_vptr_WalletStorage[4])(pWVar1,0x100000000);
  if ((char)iVar4 != '\0') {
    __assert_fail("!m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x2e6,
                  "bool wallet::LegacyScriptPubKeyMan::AddKeyPubKeyWithDB(WalletBatch &, const CKey &, const CPubKey &)"
                 );
  }
  if (this->encrypted_batch == (WalletBatch *)0x0) {
    this->encrypted_batch = batch;
    iVar4 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1c])
                      (this,secret,pubkey);
    cVar2 = (char)iVar4;
    this->encrypted_batch = (WalletBatch *)0x0;
  }
  else {
    iVar4 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1c])
                      (this,secret,pubkey);
    cVar2 = (char)iVar4;
  }
  if (cVar2 == '\0') {
    bVar3 = false;
  }
  else {
    local_58._16_4_ = 0;
    local_58._20_4_ = 0;
    local_58._24_4_ = 0;
    uStack_3c = 0;
    local_58.indirect_contents.indirect = (char *)0x0;
    local_58.indirect_contents.capacity = 0;
    local_58._12_4_ = 0;
    PKHash::PKHash((PKHash *)local_dc,pubkey);
    local_c8._M_first._M_storage._M_storage[0x10] = local_cc[0];
    local_c8._M_first._M_storage._M_storage[0x11] = local_cc[1];
    local_c8._M_first._M_storage._M_storage[0x12] = local_cc[2];
    local_c8._M_first._M_storage._M_storage[0x13] = local_cc[3];
    local_c8._0_8_ = local_dc[0];
    local_c8._8_4_ = SUB84(local_dc[1],0);
    local_c8._12_4_ = (undefined4)((ulong)local_dc[1] >> 0x20);
    local_80 = 2;
    GetScriptForDestination
              ((CScript *)&local_78.indirect_contents,(CTxDestination *)&local_c8._M_first);
    local_58.indirect_contents.indirect = local_78.indirect_contents.indirect;
    local_58._20_4_ = (undefined4)local_78._20_8_;
    local_58._24_4_ = (undefined4)((ulong)local_78._20_8_ >> 0x20);
    uStack_3c = local_5c;
    local_5c = 0;
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&local_c8._M_first);
    bVar3 = LegacyDataSPKM::HaveWatchOnly
                      (&this->super_LegacyDataSPKM,(CScript *)&local_58.indirect_contents);
    if (bVar3) {
      RemoveWatchOnly(this,(CScript *)&local_58.indirect_contents);
    }
    GetScriptForRawPubKey((CScript *)&local_c8._M_first,pubkey);
    if (0x1c < uStack_3c) {
      free(local_58.indirect_contents.indirect);
    }
    local_58._16_4_ = local_c8._16_4_;
    local_58._20_4_ = (undefined4)local_c8._20_8_;
    local_58._24_4_ = (undefined4)((ulong)local_c8._20_8_ >> 0x20);
    local_58.indirect_contents.indirect = (char *)local_c8._0_8_;
    local_58.indirect_contents.capacity = local_c8._8_4_;
    local_58._12_4_ = local_c8._12_4_;
    uStack_3c = local_c8._28_4_;
    bVar3 = LegacyDataSPKM::HaveWatchOnly
                      (&this->super_LegacyDataSPKM,(CScript *)&local_58.indirect_contents);
    if (bVar3) {
      RemoveWatchOnly(this,(CScript *)&local_58.indirect_contents);
    }
    pWVar1 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
    (*pWVar1->_vptr_WalletStorage[5])(pWVar1,batch);
    iVar4 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[9]
            )();
    bVar3 = true;
    if ((char)iVar4 == '\0') {
      CKey::GetPrivKey((CPrivKey *)&local_c8._M_first,secret);
      CPubKey::GetID((CKeyID *)&local_78.indirect_contents,pubkey);
      keyMeta = std::
                map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                ::operator[](&(this->super_LegacyDataSPKM).mapKeyMetadata,
                             (key_type *)&local_78.indirect_contents);
      bVar3 = WalletBatch::WriteKey(batch,pubkey,(CPrivKey *)&local_c8._M_first,keyMeta);
      std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> *)&local_c8._M_first
                );
    }
    if (0x1c < uStack_3c) {
      free(local_58.indirect_contents.indirect);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::AddKeyPubKeyWithDB(WalletBatch& batch, const CKey& secret, const CPubKey& pubkey)
{
    AssertLockHeld(cs_KeyStore);

    // Make sure we aren't adding private keys to private key disabled wallets
    assert(!m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS));

    // FillableSigningProvider has no concept of wallet databases, but calls AddCryptedKey
    // which is overridden below.  To avoid flushes, the database handle is
    // tunneled through to it.
    bool needsDB = !encrypted_batch;
    if (needsDB) {
        encrypted_batch = &batch;
    }
    if (!AddKeyPubKeyInner(secret, pubkey)) {
        if (needsDB) encrypted_batch = nullptr;
        return false;
    }
    if (needsDB) encrypted_batch = nullptr;

    // check if we need to remove from watch-only
    CScript script;
    script = GetScriptForDestination(PKHash(pubkey));
    if (HaveWatchOnly(script)) {
        RemoveWatchOnly(script);
    }
    script = GetScriptForRawPubKey(pubkey);
    if (HaveWatchOnly(script)) {
        RemoveWatchOnly(script);
    }

    m_storage.UnsetBlankWalletFlag(batch);
    if (!m_storage.HasEncryptionKeys()) {
        return batch.WriteKey(pubkey,
                                                 secret.GetPrivKey(),
                                                 mapKeyMetadata[pubkey.GetID()]);
    }
    return true;
}